

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O0

int getbits(archive_read_filter *self,int n)

{
  uint uVar1;
  byte *pbVar2;
  void *pvVar3;
  long local_38;
  ssize_t ret;
  long *plStack_28;
  int code;
  private_data_conflict *state;
  archive_read_filter *paStack_18;
  int n_local;
  archive_read_filter *self_local;
  
  plStack_28 = (long *)self->data;
  state._4_4_ = n;
  paStack_18 = self;
  do {
    if (state._4_4_ <= *(int *)((long)plStack_28 + 0x1c)) {
      uVar1 = *(uint *)(plStack_28 + 3);
      *(int *)(plStack_28 + 3) = (int)plStack_28[3] >> ((byte)state._4_4_ & 0x1f);
      *(int *)((long)plStack_28 + 0x1c) = *(int *)((long)plStack_28 + 0x1c) - state._4_4_;
      return uVar1 & getbits::mask[state._4_4_];
    }
    if (plStack_28[1] == 0) {
      if (plStack_28[2] != 0) {
        __archive_read_filter_consume(paStack_18->upstream,plStack_28[2]);
        plStack_28[2] = 0;
      }
      pvVar3 = __archive_read_filter_ahead(paStack_18->upstream,1,&local_38);
      *plStack_28 = (long)pvVar3;
      if (local_38 == 0) {
        return -1;
      }
      if ((local_38 < 0) || (*plStack_28 == 0)) {
        return -0x1e;
      }
      plStack_28[1] = local_38;
      plStack_28[2] = local_38;
    }
    pbVar2 = (byte *)*plStack_28;
    *plStack_28 = (long)(pbVar2 + 1);
    *(uint *)(plStack_28 + 3) =
         (uint)*pbVar2 << ((byte)*(undefined4 *)((long)plStack_28 + 0x1c) & 0x1f) |
         *(uint *)(plStack_28 + 3);
    plStack_28[1] = plStack_28[1] + -1;
    *(int *)((long)plStack_28 + 0x1c) = *(int *)((long)plStack_28 + 0x1c) + 8;
    plStack_28[4] = plStack_28[4] + 1;
  } while( true );
}

Assistant:

static int
getbits(struct archive_read_filter *self, int n)
{
	struct private_data *state = (struct private_data *)self->data;
	int code;
	ssize_t ret;
	static const int mask[] = {
		0x00, 0x01, 0x03, 0x07, 0x0f, 0x1f, 0x3f, 0x7f, 0xff,
		0x1ff, 0x3ff, 0x7ff, 0xfff, 0x1fff, 0x3fff, 0x7fff, 0xffff
	};

	while (state->bits_avail < n) {
		if (state->avail_in <= 0) {
			if (state->consume_unnotified) {
				__archive_read_filter_consume(self->upstream,
					state->consume_unnotified);
				state->consume_unnotified = 0;
			}
			state->next_in
			    = __archive_read_filter_ahead(self->upstream,
				1, &ret);
			if (ret == 0)
				return (-1);
			if (ret < 0 || state->next_in == NULL)
				return (ARCHIVE_FATAL);
			state->consume_unnotified = state->avail_in = ret;
		}
		state->bit_buffer |= *state->next_in++ << state->bits_avail;
		state->avail_in--;
		state->bits_avail += 8;
		state->bytes_in_section++;
	}

	code = state->bit_buffer;
	state->bit_buffer >>= n;
	state->bits_avail -= n;

	return (code & mask[n]);
}